

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O3

void __thiscall w3Stack::AssertTopIsValue(w3Stack *this)

{
  w3Tag wVar1;
  pointer pwVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  ulong extraout_RDX;
  string local_28;
  
  DumpStack(this,"AssertTopIsValue");
  pwVar2 = (this->super_w3StackBase).super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pwVar2 == (this->super_w3StackBase).super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_start) {
    StringFormat_abi_cxx11_(&local_28,"%lX",0);
    AssertFailedFormat("size () >= 1",&local_28);
    uVar3 = extraout_RDX;
  }
  else {
    wVar1 = pwVar2[-1].tag;
    uVar3 = (ulong)wVar1;
    if (wVar1 == Tag_Value) {
      return;
    }
  }
  StringFormat_abi_cxx11_(&local_28,"%X %X",uVar3,0x80);
  AssertFailedFormat("top ().tag == Tag_Value",&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void AssertTopIsValue ()
    {
        if (size () < 1 || top ().tag != Tag_Value)
            DumpStack ("AssertTopIsValue");
        AssertFormat (size () >= 1, ("%" FORMAT_SIZE "X", size ()));
        AssertFormat (top ().tag == Tag_Value, ("%X %X", top ().tag, Tag_Value));
    }